

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O2

RateAdaptiveCode<unsigned_int> * __thiscall
LDPC4QKD::CodeSimulationHelpers::load_ldpc_from_cscmat<bool,unsigned_int>
          (RateAdaptiveCode<unsigned_int> *__return_storage_ptr__,CodeSimulationHelpers *this,
          string *cscmat_file_path,string *rate_adaption_file_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> row_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows_to_combine;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  pair;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  
  read_matrix_from_cscmat<unsigned_int,unsigned_int>(&local_48,(LDPC4QKD *)this,cscmat_file_path);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,&local_48.first);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_d8,&local_48.second);
  if (cscmat_file_path->_M_string_length == 0) {
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_d8);
  }
  else {
    read_rate_adaption_from_csv<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,cscmat_file_path);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_d8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c0);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~pair(&local_48);
  return __return_storage_ptr__;
}

Assistant:

LDPC4QKD::RateAdaptiveCode< idx_t> load_ldpc_from_cscmat(
            const std::string &cscmat_file_path, const std::string &rate_adaption_file_path=""
    ) {
        auto pair = LDPC4QKD::read_matrix_from_cscmat<idx_t>(cscmat_file_path);
        auto colptr = pair.first;
        auto row_idx = pair.second;

        if(rate_adaption_file_path.empty()) {
            return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, row_idx);
        } else {
            std::vector<idx_t> rows_to_combine = read_rate_adaption_from_csv<idx_t>(rate_adaption_file_path);
            return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, row_idx, rows_to_combine);
        }
    }